

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O2

void ht_task_scheduler_destroy(HT_TaskScheduler *task_scheduler)

{
  size_t i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < (task_scheduler->tasks).size; uVar1 = uVar1 + 1) {
    ht_free((task_scheduler->tasks).data[uVar1]);
  }
  ht_bag_void_ptr_deinit(&task_scheduler->tasks);
  ht_free(task_scheduler);
  return;
}

Assistant:

void
ht_task_scheduler_destroy(HT_TaskScheduler* task_scheduler)
{
    size_t i = 0;
    for (i = 0; i < task_scheduler->tasks.size; i++)
    {
        ht_free(task_scheduler->tasks.data[i]);
    }

    ht_bag_void_ptr_deinit(&task_scheduler->tasks);
    ht_free(task_scheduler);
}